

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_10b69d9::CloseButton::CloseButton(CloseButton *this,QWidget *parent)

{
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget = &PTR_metaObject_007fc100;
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &PTR__CloseButton_007fc2c8;
  QWidget::setFocusPolicy((QWidget *)this,NoFocus);
  QCursor::QCursor((QCursor *)&local_30,ArrowCursor);
  QWidget::setCursor((QWidget *)this,(QCursor *)&local_30);
  QCursor::~QCursor((QCursor *)&local_30);
  QMetaObject::tr((char *)&local_30,(char *)&staticMetaObject,0x6defb3);
  QWidget::setToolTip((QWidget *)this,&local_30);
  if ((QSize)local_30.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_30.d.d = *(int *)local_30.d.d + -1;
    UNLOCK();
    if (*(int *)local_30.d.d == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_30.d.d = (Data *)(**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x70))
                                   (this);
  QWidget::resize((QWidget *)this,(QSize *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CloseButton::CloseButton(QWidget *parent)
    : QAbstractButton(parent)
{
    setFocusPolicy(Qt::NoFocus);
#ifndef QT_NO_CURSOR
    setCursor(Qt::ArrowCursor);
#endif
#if QT_CONFIG(tooltip)
    setToolTip(tr("Close Tab"));
#endif
    resize(sizeHint());
}